

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandEnhanced
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 multiErrorCodes;
  size_t sVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_bb0;
  size_t local_b90;
  byte local_b3c;
  byte local_b3a;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b1a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b19;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_990;
  undefined1 local_950 [71];
  allocator<char> local_909;
  undefined1 local_908 [8];
  string declarationTemplate;
  string local_8e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_878;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_778;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  undefined1 local_4b8 [70];
  byte local_472;
  allocator<char> local_471;
  undefined1 local_470 [8];
  string vectorSizeCheckString;
  undefined1 local_448 [8];
  string returnStatement;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3e0 [8];
  string resultCheck;
  string dataSizeChecks;
  undefined1 local_398 [8];
  string dataPreparation;
  undefined1 local_370 [8];
  string dataDeclarations;
  undefined1 local_348 [8];
  string returnVariable;
  string local_320;
  undefined1 local_300 [8];
  string className;
  undefined1 local_2d8 [8];
  string callSequence;
  undefined1 local_2b0 [8];
  string definitionTemplate;
  undefined1 local_288 [8];
  string decoratedReturnType;
  undefined1 local_260 [8];
  string returnType;
  undefined1 local_238 [8];
  string noexceptString;
  pair<bool,_std::map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  vectorSizeCheck;
  string nodiscard;
  undefined1 local_1b8 [8];
  string commandName;
  undefined1 local_190 [8];
  string argumentList;
  string argumentTemplates;
  undefined1 local_148 [8];
  string dataType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  undefined1 local_108 [6];
  bool enumerating;
  vector<unsigned_long,_std::allocator<unsigned_long>_> chainedReturnParams;
  undefined1 local_e8 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> templatedParams;
  undefined1 local_a8 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> singularParams;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  bool singular;
  bool definition_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  string *psStack_10;
  CommandFlavourFlags flavourFlags_local;
  
  this_local._7_1_ = (CommandFlavourFlags)flavourFlags.m_mask;
  skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = definition;
  skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 4;
  psStack_10 = __return_storage_ptr__;
  skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
       Flags<CommandFlavourFlagBits>::operator&
                 ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),
                  (CommandFlavourFlagBits *)
                  ((long)&skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
  determineSkippedParams
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             &commandData->params,initialSkipCount,vectorParams,returnParams,
             (bool)skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_);
  if ((skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) == 0) {
    memset(local_a8,0,0x30);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_a8);
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    determineSingularParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_a8,this,*pvVar2,vectorParams);
  }
  chainedReturnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0x40;
  bVar1 = Flags<CommandFlavourFlagBits>::operator&
                    ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),
                     (CommandFlavourFlagBits *)
                     ((long)&chainedReturnParams.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (bVar1) {
    memset(local_e8,0,0x30);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_e8);
  }
  else {
    determineVoidPointerParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_e8,this,&commandData->params);
  }
  dataTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 2;
  bVar1 = Flags<CommandFlavourFlagBits>::operator&
                    ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),
                     (CommandFlavourFlagBits *)
                     ((long)&dataTypes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (bVar1) {
    determineChainedReturnParams
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,this,
               &commandData->params,returnParams);
  }
  else {
    memset(local_108,0,0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
  if (1 < sVar3) {
    __assert_fail("chainedReturnParams.size() <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x23d4,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandEnhanced(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  dataTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
       determineEnumeration(this,vectorParams,returnParams);
  determineDataTypes_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&dataType.field_2 + 8),this,&commandData->params,vectorParams,returnParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_e8);
  combineDataTypes((string *)local_148,this,vectorParams,returnParams,
                   (bool)(dataTypes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&dataType.field_2 + 8),this_local._7_1_,true);
  generateArgumentTemplates_abi_cxx11_
            ((string *)((long)&argumentList.field_2 + 8),this,&commandData->params,returnParams,
             vectorParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_e8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,true);
  commandName.field_2._M_local_buf[0xf] = this_local._7_1_;
  generateArgumentListEnhanced_abi_cxx11_
            ((string *)local_190,this,&commandData->params,returnParams,vectorParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_a8,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_e8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108
             ,(bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
             this_local._7_1_,false);
  sVar5 = initialSkipCount;
  generateCommandName((string *)local_1b8,this,name,&commandData->params,initialSkipCount,
                      this_local._7_1_);
  multiErrorCodes = (undefined1)sVar5;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(returnParams);
  local_b3a = 1;
  if (bVar1) {
    bVar1 = std::operator==(&commandData->returnType,"VkResult");
    local_b3c = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = std::operator==(&commandData->returnType,"void");
      local_b3c = bVar1 ^ 0xff;
    }
    local_b3a = local_b3c;
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&commandData->successCodes);
  (anonymous_namespace)::generateNoDiscard_abi_cxx11_
            ((string *)&vectorSizeCheck.second._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (_anonymous_namespace_ *)(ulong)(local_b3a & 1),1 < sVar3,false,(bool)multiErrorCodes);
  needsVectorSizeCheck
            ((pair<bool,_std::map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              *)((long)&noexceptString.field_2 + 8),this,&commandData->params,vectorParams,
             returnParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_a8,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  returnType.field_2._M_local_buf[0xf] = this_local._7_1_;
  generateNoExcept((string *)local_238,this,&commandData->errorCodes,returnParams,vectorParams,
                   this_local._7_1_,(bool)(noexceptString.field_2._M_local_buf[8] & 1),true);
  decoratedReturnType.field_2._M_local_buf[0xf] = this_local._7_1_;
  generateReturnType((string *)local_260,this,returnParams,vectorParams,this_local._7_1_,true,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&dataType.field_2 + 8));
  definitionTemplate.field_2._M_local_buf[0xf] = this_local._7_1_;
  generateDecoratedReturnType
            ((string *)local_288,this,commandData,returnParams,vectorParams,
             (bool)(dataTypes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),this_local._7_1_,
             true,(string *)local_260);
  if ((skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_908,
               "\n    // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n    ${argumentTemplates} ${nodiscard} ${returnType} ${commandName}( ${argumentList} ) const ${noexcept};\n"
               ,&local_909);
    std::allocator<char>::~allocator(&local_909);
    local_b18 = &local_b10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [13])"argumentList",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    local_b18 = &local_ad0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [18])"argumentTemplates",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&argumentList.field_2 + 8));
    local_b18 = &local_a90;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [12])"commandName",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    local_b18 = &local_a50;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [10])"nodiscard",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &vectorSizeCheck.second._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_b18 = &local_a10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [9])"noexcept",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    local_b18 = &local_9d0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_b18,(char (*) [11])"returnType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
    local_b18 = &local_990;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(local_b18,(char (*) [14])"vkCommandName",name);
    local_950._0_8_ = &local_b10;
    local_950._8_8_ = 7;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_b1a);
    __l._M_len = local_950._8_8_;
    __l._M_array = (iterator)local_950._0_8_;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)(local_950 + 0x10),__l,&local_b19,&local_b1a);
    replaceWithMap(__return_storage_ptr__,(string *)local_908,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_950 + 0x10));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_950 + 0x10));
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_b1a);
    local_c00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_950;
    do {
      local_c00 = local_c00 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_c00);
    } while (local_c00 != &local_b10);
    declarationTemplate.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_908);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b0,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  ${argumentTemplates} ${nodiscard} VULKAN_HPP_INLINE ${returnType} ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n${functionPointerCheck}\n${vectorSizeCheck}\n    ${dataSizeChecks}\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${dataPreparation}\n    ${returnStatement}\n  }\n"
               ,(allocator<char> *)(callSequence.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(callSequence.field_2._M_local_buf + 0xf));
    className.field_2._M_local_buf[0xf] = this_local._7_1_;
    generateCallSequence
              ((string *)local_2d8,this,name,commandData,returnParams,vectorParams,initialSkipCount,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_a8,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_e8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,this_local._7_1_,
               true,false);
    returnVariable.field_2._M_local_buf[0xe] = '\0';
    returnVariable.field_2._M_local_buf[0xd] = '\0';
    returnVariable.field_2._M_local_buf[0xb] = '\0';
    if (initialSkipCount == 0) {
      std::allocator<char>::allocator();
      returnVariable.field_2._M_local_buf[0xb] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_300,"Context",
                 (allocator<char> *)(returnVariable.field_2._M_local_buf + 0xc));
    }
    else {
      pvVar4 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,initialSkipCount - 1);
      std::allocator<char>::allocator();
      returnVariable.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"Vk",
                 (allocator<char> *)(returnVariable.field_2._M_local_buf + 0xf));
      returnVariable.field_2._M_local_buf[0xd] = '\x01';
      stripPrefix((string *)local_300,&(pvVar4->type).type,&local_320);
    }
    if ((returnVariable.field_2._M_local_buf[0xb] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(returnVariable.field_2._M_local_buf + 0xc));
    }
    if ((returnVariable.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_320);
    }
    if ((returnVariable.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(returnVariable.field_2._M_local_buf + 0xf));
    }
    dataDeclarations.field_2._M_local_buf[0xf] = this_local._7_1_;
    generateReturnVariable_abi_cxx11_
              ((string *)local_348,this,commandData,returnParams,vectorParams,this_local._7_1_);
    dataPreparation.field_2._M_local_buf[0xf] = this_local._7_1_;
    generateDataDeclarations
              ((string *)local_370,this,commandData,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_e8,this_local._7_1_,true,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&dataType.field_2 + 8),(string *)local_148,(string *)local_260,
               (string *)local_348);
    generateDataPreparation
              ((string *)local_398,this,commandData,initialSkipCount,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_e8,this_local._7_1_,
               (bool)(dataTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&dataType.field_2 + 8));
    generateDataSizeChecks
              ((string *)((long)&resultCheck.field_2 + 8),this,commandData,returnParams,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&dataType.field_2 + 8),vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_e8,(bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_
                              & 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"::",&local_401);
    std::__cxx11::string::string
              ((string *)(returnStatement.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    generateResultCheck((string *)local_3e0,this,commandData,(string *)local_300,&local_400,
                        (string *)((long)&returnStatement.field_2 + 8),
                        (bool)(dataTypes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    std::__cxx11::string::~string((string *)(returnStatement.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(returnParams);
    if (bVar1) {
      local_b90 = 0xffffffffffffffff;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,0);
      local_b90 = *pvVar2;
    }
    vectorSizeCheckString.field_2._M_local_buf[0xf] = this_local._7_1_;
    generateReturnStatement
              ((string *)local_448,this,name,commandData,(string *)local_348,(string *)local_260,
               (string *)local_288,(string *)local_148,initialSkipCount,local_b90,this_local._7_1_,
               (bool)(dataTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),true);
    local_472 = 0;
    if ((noexceptString.field_2._M_local_buf[8] & 1U) == 0) {
      std::allocator<char>::allocator();
      local_472 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_470,"",&local_471);
    }
    else {
      generateVectorSizeCheck
                ((string *)local_470,this,name,commandData,initialSkipCount,
                 (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&vectorSizeCheck,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count,false);
    }
    if ((local_472 & 1) != 0) {
      std::allocator<char>::~allocator(&local_471);
    }
    declarationTemplate.field_2._M_local_buf[0xf] = '\x01';
    local_8c0 = &local_8b8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [13])"argumentList",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    local_8c0 = &local_878;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [18])"argumentTemplates",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&argumentList.field_2 + 8));
    local_8c0 = &local_838;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [13])"callSequence",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    local_8c0 = &local_7f8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [10])"className",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
    local_8c0 = &local_7b8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [12])"commandName",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    local_8c0 = &local_778;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [17])"dataDeclarations",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
    local_8c0 = &local_738;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [16])"dataPreparation",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
    local_8c0 = &local_6f8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [15])"dataSizeChecks",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&resultCheck.field_2 + 8));
    local_8c0 = &local_6b8;
    generateFunctionPointerCheck(&local_8e0,this,name,&commandData->requiredBy,true);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_6b8,(char (*) [21])"functionPointerCheck",&local_8e0);
    local_8c0 = &local_678;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [10])"nodiscard",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &vectorSizeCheck.second._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_8c0 = &local_638;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [9])"noexcept",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    local_8c0 = &local_5f8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [12])"resultCheck",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    local_8c0 = &local_5b8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [16])"returnStatement",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448);
    local_8c0 = &local_578;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [11])"returnType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
    local_8c0 = &local_538;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (local_8c0,(char (*) [16])"vectorSizeCheck",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470);
    local_8c0 = &local_4f8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(local_8c0,(char (*) [14])"vkCommandName",name);
    declarationTemplate.field_2._M_local_buf[0xf] = '\0';
    local_4b8._0_8_ = &local_8b8;
    local_4b8._8_8_ = 0x10;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(declarationTemplate.field_2._M_local_buf + 0xd));
    __l_00._M_len = local_4b8._8_8_;
    __l_00._M_array = (iterator)local_4b8._0_8_;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)(local_4b8 + 0x10),__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          (declarationTemplate.field_2._M_local_buf + 0xe),
          (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(declarationTemplate.field_2._M_local_buf + 0xd));
    replaceWithMap(__return_storage_ptr__,(string *)local_2b0,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_4b8 + 0x10));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_4b8 + 0x10));
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(declarationTemplate.field_2._M_local_buf + 0xd));
    local_bb0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_4b8;
    do {
      local_bb0 = local_bb0 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_bb0);
    } while (local_bb0 != &local_8b8);
    std::__cxx11::string::~string((string *)&local_8e0);
    declarationTemplate.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_470);
    std::__cxx11::string::~string((string *)local_448);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::~string((string *)(resultCheck.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_398);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)local_348);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_238);
  std::
  pair<bool,_std::map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~pair((pair<bool,_std::map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)((long)&noexceptString.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)&vectorSizeCheck.second._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)(argumentList.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dataType.field_2 + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_e8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_a8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandEnhanced( std::string const &                       name,
                                                                   CommandData const &                       commandData,
                                                                   size_t                                    initialSkipCount,
                                                                   std::vector<size_t> const &               returnParams,
                                                                   std::map<size_t, VectorParamData> const & vectorParams,
                                                                   bool                                      definition,
                                                                   CommandFlavourFlags                       flavourFlags ) const
{
  const bool singular = flavourFlags & CommandFlavourFlagBits::singular;

  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams[0], vectorParams ) : std::set<size_t>();
  std::set<size_t> templatedParams =
    ( flavourFlags & CommandFlavourFlagBits::keepVoidPtr ) ? std::set<size_t>() : determineVoidPointerParams( commandData.params );
  std::vector<size_t> chainedReturnParams =
    ( flavourFlags & CommandFlavourFlagBits::chained ) ? determineChainedReturnParams( commandData.params, returnParams ) : std::vector<size_t>();
  assert( chainedReturnParams.size() <= 1 );

  const bool               enumerating = determineEnumeration( vectorParams, returnParams );
  std::vector<std::string> dataTypes   = determineDataTypes( commandData.params, vectorParams, returnParams, templatedParams );
  std::string              dataType    = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );

  std::string argumentTemplates = generateArgumentTemplates( commandData.params, returnParams, vectorParams, templatedParams, chainedReturnParams, true );
  std::string argumentList      = generateArgumentListEnhanced(
    commandData.params, returnParams, vectorParams, skippedParams, singularParams, templatedParams, chainedReturnParams, definition, flavourFlags, false );
  std::string commandName = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );
  std::string nodiscard   = generateNoDiscard(
    !returnParams.empty() || ( ( commandData.returnType != "VkResult" ) && ( commandData.returnType != "void" ) ), 1 < commandData.successCodes.size(), false );
  std::pair<bool, std::map<size_t, std::vector<size_t>>> vectorSizeCheck =
    needsVectorSizeCheck( commandData.params, vectorParams, returnParams, singularParams, skippedParams );
  std::string noexceptString      = generateNoExcept( commandData.errorCodes, returnParams, vectorParams, flavourFlags, vectorSizeCheck.first, true );
  std::string returnType          = generateReturnType( returnParams, vectorParams, flavourFlags, true, dataTypes );
  std::string decoratedReturnType = generateDecoratedReturnType( commandData, returnParams, vectorParams, enumerating, flavourFlags, true, returnType );

  if ( definition )
  {
    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  ${argumentTemplates} ${nodiscard} VULKAN_HPP_INLINE ${returnType} ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
${functionPointerCheck}
${vectorSizeCheck}
    ${dataSizeChecks}
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${dataPreparation}
    ${returnStatement}
  }
)";

    std::string callSequence = generateCallSequence(
      name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, templatedParams, chainedReturnParams, flavourFlags, true, false );
    std::string className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::string returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, templatedParams, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string dataPreparation =
      generateDataPreparation( commandData, initialSkipCount, returnParams, vectorParams, templatedParams, flavourFlags, enumerating, dataTypes );
    std::string dataSizeChecks  = generateDataSizeChecks( commandData, returnParams, dataTypes, vectorParams, templatedParams, singular );
    std::string resultCheck     = generateResultCheck( commandData, className, "::", commandName, enumerating );
    std::string returnStatement = generateReturnStatement( name,
                                                           commandData,
                                                           returnVariable,
                                                           returnType,
                                                           decoratedReturnType,
                                                           dataType,
                                                           initialSkipCount,
                                                           returnParams.empty() ? INVALID_INDEX : returnParams[0],
                                                           flavourFlags,
                                                           enumerating,
                                                           true );
    std::string vectorSizeCheckString =
      vectorSizeCheck.first ? generateVectorSizeCheck( name, commandData, initialSkipCount, vectorSizeCheck.second, skippedParams, false ) : "";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "argumentTemplates", argumentTemplates },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "dataPreparation", dataPreparation },
                             { "dataSizeChecks", dataSizeChecks },
                             { "functionPointerCheck", generateFunctionPointerCheck( name, commandData.requiredBy, true ) },
                             { "nodiscard", nodiscard },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatement", returnStatement },
                             { "returnType", decoratedReturnType },
                             { "vectorSizeCheck", vectorSizeCheckString },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
    // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
    ${argumentTemplates} ${nodiscard} ${returnType} ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "argumentTemplates", argumentTemplates },
                             { "commandName", commandName },
                             { "nodiscard", nodiscard },
                             { "noexcept", noexceptString },
                             { "returnType", decoratedReturnType },
                             { "vkCommandName", name } } );
  }
}